

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O2

Expression * slang::ast::AssertionInstanceExpression::makeDefault(Symbol *symbol)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  _Variadic_union<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
  _Var3;
  SourceLocation formal;
  PropertyExprSyntax *propExpr;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Symbol *args_1;
  int iVar7;
  AssertionInstanceExpression *pAVar8;
  AssertionExpr *args_2;
  undefined4 extraout_var;
  value_type *elements;
  ulong uVar9;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX;
  SyntaxKind typeKind;
  Compilation *dst;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  PropertySymbol *prop;
  iterator __begin2;
  SyntaxNode *pSVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  byte bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  LookupLocation LVar22;
  SmallVector<const_slang::ast::Symbol_*,_5UL> localVars;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::AssertionPortSymbol_*&,_void>
  x;
  SourceRange range;
  AssertionInstanceDetails instance;
  try_emplace_args_t local_1f9;
  Type *local_1f8;
  SourceLocation local_1f0;
  _Variadic_union<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
  local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined1 *local_1b8;
  PropertyExprSyntax *local_1b0;
  Compilation *local_1a0;
  _Variadic_union<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
  local_198;
  _Variadic_union<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
  local_190;
  uint32_t local_188;
  undefined4 local_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 *local_160;
  SourceLocation local_158 [2];
  Symbol *local_148;
  SyntaxNode *local_140;
  undefined1 local_138 [24];
  _Variadic_union<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
  local_120;
  uint32_t uStack_118;
  undefined4 uStack_114;
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 *local_f0;
  undefined1 local_e8 [24];
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
  local_d0 [8];
  ulong local_c8;
  group_type_pointer local_c0;
  value_type_pointer local_b8;
  ulong local_b0;
  ulong local_a8;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  _Var3 = (_Variadic_union<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
           )symbol->parentScope;
  LVar22 = LookupLocation::before(symbol);
  uStack_118 = LVar22.index;
  local_110 = (undefined1  [16])0x0;
  local_f0 = (undefined1 *)0x0;
  local_100 = (undefined1  [16])0x0;
  local_1a0 = *(Compilation **)_Var3;
  local_120 = _Var3;
  if (symbol->kind == LetDecl) {
    local_1f8 = local_1a0->voidType;
  }
  else {
    if (symbol->kind == Property) {
      typeKind = PropertyType;
    }
    else {
      typeKind = SequenceType;
    }
    local_1f8 = Compilation::getType(local_1a0,typeKind);
  }
  local_198 = (_Variadic_union<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
               )(symbol + 1);
  pSVar15 = symbol[1].originatingSyntax;
  lVar11 = *(long *)(symbol + 2);
  AssertionInstanceDetails::AssertionInstanceDetails((AssertionInstanceDetails *)local_e8);
  local_e8._8_8_ = &local_120;
  local_e8._16_8_ = symbol->location;
  local_140 = (SyntaxNode *)(&pSVar15->kind + lVar11 * 2);
  local_1f0 = (SourceLocation)0x0;
  local_148 = symbol;
  local_e8._0_8_ = symbol;
  do {
    args_1 = local_148;
    if (pSVar15 == local_140) {
      local_190 = local_198;
      local_188 = 0xffffffff;
      local_180 = 0;
      uStack_178 = 0;
      uStack_170 = 0;
      uStack_168 = 0;
      local_160 = local_e8;
      if (local_148->kind == LetDecl) {
        pAVar8 = (AssertionInstanceExpression *)
                 Expression::create(local_1a0,(ExpressionSyntax *)local_148[2].name._M_len,
                                    (ASTContext *)&local_190._M_first,
                                    (bitmask<slang::ast::ASTFlags>)0x0,(Type *)0x0);
      }
      else {
        local_1e8 = (_Variadic_union<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                     )&uStack_1d0;
        uStack_1e0 = 0;
        local_1d8 = 5;
        args_2 = bindAssertionBody(local_148,local_148->originatingSyntax,
                                   (ASTContext *)&local_190._M_first,local_1f0,
                                   (AssertionInstanceDetails *)local_e8,
                                   (SmallVectorBase<const_slang::ast::Symbol_*> *)
                                   &local_1e8._M_first);
        dst = local_1a0;
        local_138._0_8_ = args_1->location;
        local_138._8_8_ =
             local_138._0_8_ * 0x10 + 0x100000000 >> 4 & 0xfffffffff0000000U |
             (ulong)((uint)local_138._0_8_ & 0xfffffff);
        local_158[0] = (SourceLocation)((ulong)local_158[0] & 0xffffffffffffff00);
        pAVar8 = BumpAllocator::
                 emplace<slang::ast::AssertionInstanceExpression,slang::ast::Type_const&,slang::ast::Symbol_const&,slang::ast::AssertionExpr_const&,bool,slang::SourceRange&>
                           (&local_1a0->super_BumpAllocator,local_1f8,args_1,args_2,
                            (bool *)local_158,(SourceRange *)local_138);
        iVar7 = SmallVectorBase<const_slang::ast::Symbol_*>::copy
                          ((SmallVectorBase<const_slang::ast::Symbol_*> *)&local_1e8._M_first,
                           (EVP_PKEY_CTX *)dst,src);
        (pAVar8->localVars)._M_ptr = (pointer)CONCAT44(extraout_var,iVar7);
        (pAVar8->localVars)._M_extent._M_extent_value = extraout_RDX;
        SmallVectorBase<const_slang::ast::Symbol_*>::cleanup
                  ((SmallVectorBase<const_slang::ast::Symbol_*> *)&local_1e8._M_first,
                   (EVP_PKEY_CTX *)dst);
      }
      AssertionInstanceDetails::~AssertionInstanceDetails((AssertionInstanceDetails *)local_e8);
      return &pAVar8->super_Expression;
    }
    formal = *(SourceLocation *)pSVar15;
    if (*(PropertyExprSyntax **)((long)formal + 0x80) == (PropertyExprSyntax *)0x0) {
      local_1b8 = local_f0;
      local_1e8 = local_120;
      uStack_1e0 = CONCAT44(uStack_114,uStack_118);
      local_1d8 = local_110._0_8_;
      uStack_1d0 = local_110._8_8_;
      local_1c8 = local_100._0_8_;
      uStack_1c0 = local_100._8_8_;
      local_1b0 = (PropertyExprSyntax *)0x0;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = formal;
      uVar10 = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
      uVar9 = uVar10 >> ((byte)local_d0[0] & 0x3f);
      uVar2 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[uVar10 & 0xff];
      uVar13 = 0;
      uVar12 = uVar9;
      do {
        pgVar1 = local_c0 + uVar12;
        local_58 = pgVar1->m[0].n;
        uStack_57 = pgVar1->m[1].n;
        uStack_56 = pgVar1->m[2].n;
        bStack_55 = pgVar1->m[3].n;
        uStack_54 = pgVar1->m[4].n;
        uStack_53 = pgVar1->m[5].n;
        uStack_52 = pgVar1->m[6].n;
        bStack_51 = pgVar1->m[7].n;
        uStack_50 = pgVar1->m[8].n;
        uStack_4f = pgVar1->m[9].n;
        uStack_4e = pgVar1->m[10].n;
        bStack_4d = pgVar1->m[0xb].n;
        uStack_4c = pgVar1->m[0xc].n;
        uStack_4b = pgVar1->m[0xd].n;
        uStack_4a = pgVar1->m[0xe].n;
        bStack_49 = pgVar1->m[0xf].n;
        uVar16 = (uchar)uVar2;
        auVar21[0] = -(local_58 == uVar16);
        uVar17 = (uchar)((uint)uVar2 >> 8);
        auVar21[1] = -(uStack_57 == uVar17);
        uVar18 = (uchar)((uint)uVar2 >> 0x10);
        auVar21[2] = -(uStack_56 == uVar18);
        bVar19 = (byte)((uint)uVar2 >> 0x18);
        auVar21[3] = -(bStack_55 == bVar19);
        auVar21[4] = -(uStack_54 == uVar16);
        auVar21[5] = -(uStack_53 == uVar17);
        auVar21[6] = -(uStack_52 == uVar18);
        auVar21[7] = -(bStack_51 == bVar19);
        auVar21[8] = -(uStack_50 == uVar16);
        auVar21[9] = -(uStack_4f == uVar17);
        auVar21[10] = -(uStack_4e == uVar18);
        auVar21[0xb] = -(bStack_4d == bVar19);
        auVar21[0xc] = -(uStack_4c == uVar16);
        auVar21[0xd] = -(uStack_4b == uVar17);
        auVar21[0xe] = -(uStack_4a == uVar18);
        auVar21[0xf] = -(bStack_49 == bVar19);
        for (uVar14 = (uint)(ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe);
            local_138._0_8_ = formal, uVar14 != 0; uVar14 = uVar14 - 1 & uVar14) {
          uVar4 = 0;
          if (uVar14 != 0) {
            for (; (uVar14 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
            }
          }
          if (formal == (SourceLocation)local_b8[uVar12 * 0xf + (ulong)uVar4].first)
          goto LAB_003c71dc;
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar10 & 7] & bStack_49) == 0)
        break;
        lVar11 = uVar12 + uVar13;
        uVar13 = uVar13 + 1;
        uVar12 = lVar11 + 1U & local_c8;
      } while (uVar13 <= local_c8);
      if (local_a8 < local_b0) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
        ::
        unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax*,slang::ast::ASTContext>>
                  ((locator *)&local_190._M_first,local_d0,uVar9,uVar10,
                   (try_emplace_args_t *)local_158,(Symbol **)local_138,
                   (tuple<slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *)
                   &local_1e8._M_first);
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax*,slang::ast::ASTContext>>
                  ((locator *)&local_190._M_first,local_d0,uVar10,(try_emplace_args_t *)local_158,
                   (Symbol **)local_138,
                   (tuple<slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *)
                   &local_1e8._M_first);
      }
    }
    else {
      LVar22 = LookupLocation::after((Symbol *)formal);
      local_190 = local_198;
      local_188 = LVar22.index;
      uStack_178 = 0;
      uStack_170 = 0;
      uStack_168 = 0;
      local_1b8 = local_e8;
      local_180 = 0x2000000000;
      propExpr = *(PropertyExprSyntax **)((long)formal + 0x80);
      local_1c8 = 0;
      uStack_1c0 = 0;
      local_1d8 = 0x2000000000;
      uStack_1d0 = 0;
      local_1e8 = local_198;
      uStack_1e0 = CONCAT44(local_184,local_188);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = formal;
      uVar10 = SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),0);
      uVar9 = uVar10 >> ((byte)local_d0[0] & 0x3f);
      uVar2 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[uVar10 & 0xff];
      uVar13 = 0;
      uVar12 = uVar9;
      do {
        pgVar1 = local_c0 + uVar12;
        local_48 = pgVar1->m[0].n;
        uStack_47 = pgVar1->m[1].n;
        uStack_46 = pgVar1->m[2].n;
        bStack_45 = pgVar1->m[3].n;
        uStack_44 = pgVar1->m[4].n;
        uStack_43 = pgVar1->m[5].n;
        uStack_42 = pgVar1->m[6].n;
        bStack_41 = pgVar1->m[7].n;
        uStack_40 = pgVar1->m[8].n;
        uStack_3f = pgVar1->m[9].n;
        uStack_3e = pgVar1->m[10].n;
        bStack_3d = pgVar1->m[0xb].n;
        uStack_3c = pgVar1->m[0xc].n;
        uStack_3b = pgVar1->m[0xd].n;
        uStack_3a = pgVar1->m[0xe].n;
        bStack_39 = pgVar1->m[0xf].n;
        uVar16 = (uchar)uVar2;
        auVar20[0] = -(local_48 == uVar16);
        uVar17 = (uchar)((uint)uVar2 >> 8);
        auVar20[1] = -(uStack_47 == uVar17);
        uVar18 = (uchar)((uint)uVar2 >> 0x10);
        auVar20[2] = -(uStack_46 == uVar18);
        bVar19 = (byte)((uint)uVar2 >> 0x18);
        auVar20[3] = -(bStack_45 == bVar19);
        auVar20[4] = -(uStack_44 == uVar16);
        auVar20[5] = -(uStack_43 == uVar17);
        auVar20[6] = -(uStack_42 == uVar18);
        auVar20[7] = -(bStack_41 == bVar19);
        auVar20[8] = -(uStack_40 == uVar16);
        auVar20[9] = -(uStack_3f == uVar17);
        auVar20[10] = -(uStack_3e == uVar18);
        auVar20[0xb] = -(bStack_3d == bVar19);
        auVar20[0xc] = -(uStack_3c == uVar16);
        auVar20[0xd] = -(uStack_3b == uVar17);
        auVar20[0xe] = -(uStack_3a == uVar18);
        auVar20[0xf] = -(bStack_39 == bVar19);
        for (uVar14 = (uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe);
            local_1b0 = propExpr, local_160 = local_1b8, local_158[0] = formal, uVar14 != 0;
            uVar14 = uVar14 - 1 & uVar14) {
          uVar4 = 0;
          if (uVar14 != 0) {
            for (; (uVar14 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
            }
          }
          if (formal == (SourceLocation)local_b8[uVar12 * 0xf + (ulong)uVar4].first)
          goto LAB_003c71b9;
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar10 & 7] & bStack_39) == 0)
        break;
        lVar11 = uVar12 + uVar13;
        uVar13 = uVar13 + 1;
        uVar12 = lVar11 + 1U & local_c8;
      } while (uVar13 <= local_c8);
      if (local_a8 < local_b0) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
        ::
        unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>
                  ((locator *)local_138,local_d0,uVar9,uVar10,&local_1f9,(Symbol **)local_158,
                   (tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *)
                   &local_1e8._M_first);
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>
                  ((locator *)local_138,local_d0,uVar10,&local_1f9,(Symbol **)local_158,
                   (tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *)
                   &local_1e8._M_first);
      }
LAB_003c71b9:
      local_1e8 = (_Variadic_union<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   )0x0;
      uStack_1e0 = uStack_1e0 & 0xffffffffffffff00;
      checkAssertionArg(propExpr,(AssertionPortSymbol *)formal,(ASTContext *)&local_190._M_first,
                        (ActualArg *)&local_1e8._M_first,false);
    }
LAB_003c71dc:
    if (((((ulong)local_1f0 & 0xfffffff) == 0) && (*(bool *)((long)formal + 0x8c) == true)) &&
       ((((optional<slang::ast::ArgumentDirection> *)((long)formal + 0x88))->
        super__Optional_base<slang::ast::ArgumentDirection,_true,_true>)._M_payload.
        super__Optional_payload_base<slang::ast::ArgumentDirection>._M_payload._M_value - Out < 2))
    {
      local_1f0 = *(SourceLocation *)((long)formal + 0x18);
    }
    pSVar15 = (SyntaxNode *)&pSVar15->parent;
  } while( true );
}

Assistant:

Expression& AssertionInstanceExpression::makeDefault(const Symbol& symbol) {
    auto parentScope = symbol.getParentScope();
    SLANG_ASSERT(parentScope);

    ASTContext context(*parentScope, LookupLocation::before(symbol));
    auto& comp = context.getCompilation();
    const Type* type;
    const Scope* symbolScope;
    std::span<const AssertionPortSymbol* const> formalPorts;

    switch (symbol.kind) {
        case SymbolKind::Sequence: {
            auto& seq = symbol.as<SequenceSymbol>();
            type = &comp.getType(SyntaxKind::SequenceType);
            formalPorts = seq.ports;
            symbolScope = &seq;
            break;
        }
        case SymbolKind::Property: {
            auto& prop = symbol.as<PropertySymbol>();
            type = &comp.getType(SyntaxKind::PropertyType);
            formalPorts = prop.ports;
            symbolScope = &prop;
            break;
        }
        case SymbolKind::LetDecl: {
            auto& let = symbol.as<LetDeclSymbol>();
            type = &comp.getVoidType();
            formalPorts = let.ports;
            symbolScope = &let;
            break;
        }
        default:
            SLANG_UNREACHABLE;
    }

    AssertionInstanceDetails instance;
    instance.symbol = &symbol;
    instance.prevContext = &context;
    instance.instanceLoc = symbol.location;

    // Bind default args, make placeholder entries for args that don't have defaults.
    SourceLocation outputLocalVarArgLoc;
    for (auto formal : formalPorts) {
        if (!formal->defaultValueSyntax) {
            instance.argumentMap.emplace(formal,
                                         std::make_tuple((PropertyExprSyntax*)nullptr, context));
        }
        else {
            ASTContext ctx(*symbolScope, LookupLocation::after(*formal));
            ctx.assertionInstance = &instance;
            ctx.flags |= ASTFlags::AssertionDefaultArg;

            auto expr = formal->defaultValueSyntax;
            instance.argumentMap.emplace(formal, std::make_tuple(expr, ctx));

            ActualArg arg;
            checkAssertionArg(*expr, *formal, ctx, arg, false);
        }

        if (!outputLocalVarArgLoc && (formal->direction == ArgumentDirection::InOut ||
                                      formal->direction == ArgumentDirection::Out)) {
            outputLocalVarArgLoc = formal->location;
        }
    }

    ASTContext bodyContext(*symbolScope, LookupLocation::max);
    bodyContext.assertionInstance = &instance;

    // Let declarations expand directly to an expression.
    if (symbol.kind == SymbolKind::LetDecl)
        return create(comp, *symbol.as<LetDeclSymbol>().exprSyntax, bodyContext);

    auto bodySyntax = symbol.getSyntax();
    SLANG_ASSERT(bodySyntax);

    SmallVector<const Symbol*> localVars;
    auto& body = bindAssertionBody(symbol, *bodySyntax, bodyContext, outputLocalVarArgLoc, instance,
                                   localVars);

    SourceRange range{symbol.location, symbol.location + 1};
    auto result = comp.emplace<AssertionInstanceExpression>(*type, symbol, body,
                                                            /* isRecursiveProperty */ false, range);
    result->localVars = localVars.copy(comp);
    return *result;
}